

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_CreateArenaConstructable_Test::~ArenaTest_CreateArenaConstructable_Test
          (ArenaTest_CreateArenaConstructable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateArenaConstructable) {
  TestAllTypes original;
  TestUtil::SetAllFields(&original);

  Arena arena;
  auto copied = Arena::Create<TestAllTypes>(&arena, original);

  TestUtil::ExpectAllFieldsSet(*copied);
  EXPECT_EQ(copied->GetArena(), &arena);
  EXPECT_EQ(copied->optional_nested_message().GetArena(), &arena);
}